

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

Index __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index agentI,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *observations)

{
  pointer pvVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  Index IVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var_00 [56];
  
  uVar9 = (ulong)agentI;
  pvVar1 = (this->_m_firstOHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(this->_m_firstOHIforT).
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar10 = uVar9;
  if (uVar9 <= uVar7 && uVar7 - uVar9 != 0) {
    uVar10 = (ulong)t;
    lVar11 = *(long *)&pvVar1[uVar9].
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data;
    if (uVar10 < (ulong)((long)*(pointer *)
                                ((long)&pvVar1[uVar9].
                                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar11 >> 3)) {
      IVar4 = Globals::CastLIndexToIndex(*(LIndex *)(lVar11 + uVar10 * 8));
      puVar2 = (observations->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
      auVar12._8_56_ = extraout_var;
      auVar12._0_8_ = extraout_XMM0_Qa;
      if (t != 0) {
        uVar7 = (ulong)IVar4;
        auVar3 = vcvtusi2sd_avx512f(auVar12._0_16_,uVar5);
        iVar8 = t - 1;
        lVar11 = 0;
        do {
          auVar13._0_8_ = pow(auVar3._0_8_,(double)iVar8);
          auVar13._8_56_ = extraout_var_00;
          lVar6 = vcvttsd2usi_avx512f(auVar13._0_16_);
          uVar7 = uVar7 + (ulong)*(uint *)((long)puVar2 + lVar11) * lVar6;
          IVar4 = (Index)uVar7;
          lVar11 = lVar11 + 4;
          iVar8 = iVar8 + -1;
        } while (uVar10 << 2 != lVar11);
      }
      return IVar4;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

Index PlanningUnitMADPDiscrete::GetObservationHistoryIndex(Index agentI, 
        Index t, const vector<Index>& observations) const
{
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(_m_firstOHIforT.at(agentI).at(t)), 
                &observations[0],
                GetNrObservations(agentI)
                )
          );

    //observations is a vector with the observation indices for stage 0...t-1
    //<o^0, o^1, ... , o^(t-1) >
    //from this we want to find the history observation index, which is given
    //by:
    //      o^0 * |O|^(t-1) + ... + o^(t-1) * |O|^0     + stage offset
    //
    //where |O| is the `base' of the number as specified by the tuple of 
    //indices
    //
    //
    //size_t this_OHI=_m_firstOHIforT.at(agentI).at(t);
    //size_t nrO = GetNrObservations(agentI);
    //for (Index ts=0; ts<t; ts++)
    //{
        //int exponent = t-1 - ts;
        //size_t b = (size_t) pow((double)nrO, (double)(exponent));
        //this_OHI += observations.at(ts) * b;
    //}
    //return(this_OHI);
}